

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall StringType::Prepare(StringType *this,Env *env,int flags)

{
  long *plVar1;
  int iVar2;
  Type *pTVar3;
  Type *pTVar4;
  char *this_00;
  void *pvVar5;
  uint in_EDX;
  undefined8 in_RSI;
  Type *in_RDI;
  ID *string_length_var;
  int in_stack_00000144;
  Env *in_stack_00000148;
  Type *in_stack_00000150;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  string local_40 [32];
  Type *local_20;
  undefined8 local_10;
  
  if ((in_EDX & 1) != 0) {
    local_10 = in_RSI;
    iVar2 = (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x13])(in_RDI,in_RSI);
    if (iVar2 < 0) {
      pTVar3 = (Type *)operator_new(0x78);
      uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
      pTVar4 = (Type *)Type::value_var(in_RDI);
      if (pTVar4 == (Type *)0x0) {
        this_00 = "val";
      }
      else {
        Type::value_var(in_RDI);
        this_00 = ID::Name((ID *)0x14a7a8);
      }
      strfmt_abi_cxx11_((char *)local_40,"%s_string_length",this_00);
      ID::ID((ID *)CONCAT44(in_stack_ffffffffffffffb4,uVar6),(string *)in_RDI);
      std::__cxx11::string::~string(local_40);
      local_20 = pTVar3;
      pvVar5 = operator_new(0xa0);
      pTVar3 = local_20;
      pTVar4 = Type::Clone(pTVar4);
      TempVarField::TempVarField((TempVarField *)this_00,(ID *)pTVar4,pTVar3);
      *(void **)&in_RDI[1].super_Object.filename = pvVar5;
      plVar1 = *(long **)&in_RDI[1].super_Object.filename;
      (**(code **)(*plVar1 + 0x20))(plVar1,local_10);
    }
  }
  Type::Prepare(in_stack_00000150,in_stack_00000148,in_stack_00000144);
  return;
}

Assistant:

void StringType::Prepare(Env* env, int flags)
	{
	if ( (flags & TO_BE_PARSED) && StaticSize(env) < 0 )
		{
		ID* string_length_var = new ID(
			strfmt("%s_string_length", value_var() ? value_var()->Name() : "val"));
		string_length_var_field_ = new TempVarField(string_length_var, extern_type_int->Clone());
		string_length_var_field_->Prepare(env);
		}
	Type::Prepare(env, flags);
	}